

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_list.c
# Opt level: O0

ngx_list_t * ngx_list_create(ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  ngx_int_t nVar1;
  ngx_list_t *list;
  size_t size_local;
  ngx_uint_t n_local;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)ngx_palloc(pool,0x38);
  if (pool_local == (ngx_pool_t *)0x0) {
    pool_local = (ngx_pool_t *)0x0;
  }
  else {
    nVar1 = ngx_list_init((ngx_list_t *)pool_local,pool,n,size);
    if (nVar1 != 0) {
      pool_local = (ngx_pool_t *)0x0;
    }
  }
  return (ngx_list_t *)pool_local;
}

Assistant:

ngx_list_t *
ngx_list_create(ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    ngx_list_t  *list;

    list = ngx_palloc(pool, sizeof(ngx_list_t));
    if (list == NULL) {
        return NULL;
    }

    if (ngx_list_init(list, pool, n, size) != NGX_OK) {
        return NULL;
    }

    return list;
}